

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

void __thiscall XmlRpc::XmlRpcValue::assertType(XmlRpcValue *this,Type t)

{
  undefined8 uVar1;
  int in_ESI;
  int *in_RDI;
  undefined3 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffbc;
  XmlRpcException *in_stack_ffffffffffffffc0;
  undefined1 local_31 [17];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*in_RDI != in_ESI) {
    uVar2 = CONCAT13(1,in_stack_ffffffffffffffb8);
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    XmlRpcException::XmlRpcException
              (in_stack_ffffffffffffffc0,(string *)CONCAT44(in_stack_ffffffffffffffbc,uVar2),
               (int)((ulong)local_31 >> 0x20));
    __cxa_throw(uVar1,&XmlRpcException::typeinfo,XmlRpcException::~XmlRpcException);
  }
  return;
}

Assistant:

void XmlRpcValue::assertType(Type t) const
  {
    if (_type != t)
      throw XmlRpcException("type error");
  }